

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_internal_add_path
          (GeneratedCodeInfo_Annotation *this,int32 value)

{
  int *in_RDI;
  RepeatedField<int> *unaff_retaddr;
  
  RepeatedField<int>::Add(unaff_retaddr,in_RDI);
  return;
}

Assistant:

inline void GeneratedCodeInfo_Annotation::_internal_add_path(::PROTOBUF_NAMESPACE_ID::int32 value) {
  path_.Add(value);
}